

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseResolver<char_const*>::resolve<char_const*>
          (PromiseResolver<char_const*> *this,char **value)

{
  QPromise<const_char_*> *pQVar1;
  Data *pDVar2;
  PromiseData<const_char_*> *pPVar3;
  QPromise<const_char_*> *promise;
  char **value_local;
  PromiseResolver<const_char_*> *this_local;
  
  pDVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<const_char_*>::Data>::
           operator->((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<const_char_*>::Data>
                       *)this);
  pQVar1 = pDVar2->promise;
  if (pQVar1 != (QPromise<const_char_*> *)0x0) {
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<const_char_*>_>::operator->
                       (&(pQVar1->super_QPromiseBase<const_char_*>).m_d);
    PromiseData<char_const*>::resolve<char_const*>((PromiseData<char_const*> *)pPVar3,value);
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<const_char_*>_>::operator->
                       (&(pQVar1->super_QPromiseBase<const_char_*>).m_d);
    PromiseDataBase<const_char_*,_void_(const_char_*const_&)>::dispatch
              (&pPVar3->super_PromiseDataBase<const_char_*,_void_(const_char_*const_&)>);
    PromiseResolver<const_char_*>::release((PromiseResolver<const_char_*> *)this);
  }
  return;
}

Assistant:

void resolve(V&& value)
    {
        auto promise = m_d->promise;
        if (promise) {
            Q_ASSERT(promise->isPending());
            promise->m_d->resolve(std::forward<V>(value));
            promise->m_d->dispatch();
            release();
        }
    }